

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall
gvr::anon_unknown_3::PLYProperty::PLYProperty
          (PLYProperty *this,string *propname,ply_type type,ply_encoding encoding)

{
  PLYValue *pPVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  undefined4 *in_RDI;
  ply_encoding in_stack_00000088;
  ply_type in_stack_0000008c;
  
  *in_RDI = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  in_RDI[10] = 0;
  in_RDI[0xb] = in_EDX;
  pPVar1 = createValue(in_stack_0000008c,in_stack_00000088);
  *(PLYValue **)(in_RDI + 0xc) = pPVar1;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const std::string &propname, ply_type type, ply_encoding encoding):
  enc(encoding), name(propname)
{
  tsize=ply_none;
  tvalue=type;
  value=createValue(type, encoding);
  receiver=0;
}